

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_123::PromisedAsyncOutputStream::tryPumpFrom
          (PromisedAsyncOutputStream *this,AsyncInputStream *input,uint64_t amount)

{
  _func_int **pp_Var1;
  PromiseArena *pPVar2;
  undefined8 uVar3;
  void *pvVar4;
  PromiseArena *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar5;
  Maybe<kj::Promise<unsigned_long>_> MVar6;
  undefined1 local_68 [24];
  EventLoop *local_50;
  SourceLocation local_48;
  
  pp_Var1 = input[4]._vptr_AsyncInputStream;
  if (pp_Var1 == (_func_int **)0x0) {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_68);
    uVar3 = local_68._0_8_;
    pPVar2 = ((PromiseArenaMember *)local_68._0_8_)->arena;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_68._0_8_ - (long)pPVar2) < 0x38) {
      pvVar4 = operator_new(0x400);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)((long)pvVar4 + 0x3c8),(OwnPromiseNode *)local_68,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2532:39)>
                 ::anon_class_24_3_e7c12ea1_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3c8) = &PTR_destroy_006e0728;
      *(AsyncInputStream **)((long)pvVar4 + 1000) = input;
      *(uint64_t *)((long)pvVar4 + 0x3f0) = amount;
      *(PromiseArena **)((long)pvVar4 + 0x3f8) = in_RCX;
      *(void **)((long)pvVar4 + 0x3d0) = pvVar4;
      local_68._16_8_ = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3c8);
    }
    else {
      ((PromiseArenaMember *)local_68._0_8_)->arena = (PromiseArena *)0x0;
      local_68._8_8_ = &((PromiseArenaMember *)(local_68._0_8_ + -0x40))->arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)local_68._8_8_,(OwnPromiseNode *)local_68,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2532:39)>
                 ::anon_class_24_3_e7c12ea1_for_func::operator());
      ((PromiseArenaMember *)(uVar3 + -0x40))->arena = (PromiseArena *)&PTR_destroy_006e0728;
      ((PromiseArenaMember *)(uVar3 + -0x20))->arena = (PromiseArena *)input;
      ((PromiseArenaMember *)(uVar3 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)amount;
      ((PromiseArenaMember *)(uVar3 + -0x10))->arena = in_RCX;
      ((PromiseArenaMember *)(uVar3 + -0x30))->_vptr_PromiseArenaMember = (_func_int **)pPVar2;
      local_68._16_8_ = local_68._8_8_;
    }
    local_48.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
    ;
    local_48.function = "then";
    local_48.lineNumber = 0x58b;
    local_48.columnNumber = 0x4c;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_50,(OwnPromiseNode *)(local_68 + 0x10),&local_48);
    uVar3 = local_68._16_8_;
    aVar5 = extraout_RDX_00;
    if ((TransformPromiseNodeBase *)local_68._16_8_ != (TransformPromiseNodeBase *)0x0) {
      local_68._16_8_ = (TransformPromiseNodeBase *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
      aVar5 = extraout_RDX_01;
    }
    uVar3 = local_68._0_8_;
    *(undefined1 *)&(this->super_AsyncOutputStream)._vptr_AsyncOutputStream = 1;
    (this->promise).hub.disposer = (Disposer *)local_50;
    if ((PromiseArenaMember *)local_68._0_8_ != (PromiseArenaMember *)0x0) {
      local_68._0_8_ = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
      aVar5 = extraout_RDX_02;
    }
  }
  else {
    (**(code **)(*pp_Var1 + 0x10))(this,pp_Var1,amount);
    aVar5 = extraout_RDX;
  }
  MVar6.ptr.field_1 = aVar5;
  MVar6.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar6.ptr;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> tryPumpFrom(
      kj::AsyncInputStream& input, uint64_t amount = kj::maxValue) override {
    KJ_IF_SOME(s, stream) {
      return s->tryPumpFrom(input, amount);
    } else {
      return promise.addBranch().then([this,&input,amount]() {
        // Call input.pumpTo() on the resolved stream instead.
        return input.pumpTo(*KJ_ASSERT_NONNULL(stream), amount);
      });
    }
  }